

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

void duckdb::StructDatePart::Function<duckdb::interval_t>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  value_type vVar1;
  unsigned_long *puVar2;
  pointer puVar3;
  size_type __n;
  BoundFunctionExpression *pBVar4;
  pointer pFVar5;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference pvVar6;
  reference pvVar7;
  reference ppdVar8;
  reference pvVar9;
  pointer pVVar10;
  type pVVar11;
  idx_t iVar12;
  size_t col;
  ulong uVar13;
  idx_t row_idx;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *__range5;
  value_type pdVar14;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *child_entry;
  ulong uVar15;
  pointer this_00;
  part_codes_t *part_codes;
  allocator_type local_e1;
  reference local_e0;
  idx_t local_d8;
  part_mask_t local_d0;
  vector<unsigned_long,_true> owners;
  double_vec double_values;
  bigint_vec bigint_values;
  UnifiedVectorFormat rdata;
  
  pBVar4 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar5 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar4->bind_info);
  local_d8 = args->count;
  local_e0 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  rdata.sel = (SelectionVector *)0x0;
  ::std::vector<long_*,_std::allocator<long_*>_>::vector
            (&bigint_values.super_vector<long_*,_std::allocator<long_*>_>,0x16,(value_type *)&rdata,
             (allocator_type *)&double_values);
  rdata.sel = (SelectionVector *)0x0;
  ::std::vector<double_*,_std::allocator<double_*>_>::vector
            (&double_values.super_vector<double_*,_std::allocator<double_*>_>,2,(value_type *)&rdata
             ,(allocator_type *)&owners);
  part_codes = (part_codes_t *)(pFVar5 + 4);
  local_d0 = DatePart::StructOperator::GetMask(part_codes);
  this = StructVector::GetEntries(result);
  rdata.sel = (SelectionVector *)
              ((long)(this->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->
                     super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&owners,0x18,
             (value_type_conflict2 *)&rdata,&local_e1);
  for (uVar13 = 0;
      uVar13 < (ulong)((long)(this->
                             super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->
                             super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar13 = uVar13 + 1) {
    pvVar6 = vector<duckdb::DatePartSpecifier,_true>::get<true>(part_codes,uVar13);
    vVar1 = *pvVar6;
    pvVar7 = vector<unsigned_long,_true>::get<true>(&owners,(ulong)vVar1);
    if (*pvVar7 ==
        (long)(this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) {
      pvVar7 = vector<unsigned_long,_true>::get<true>(&owners,(ulong)vVar1);
      *pvVar7 = uVar13;
    }
  }
  if (local_e0->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar2 = (local_e0->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      ConstantVector::SetNull(result,false);
      for (uVar13 = 0;
          uVar13 < (ulong)((long)(this->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar13 = uVar13 + 1) {
        pvVar9 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                 ::get<true>(this,uVar13);
        pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (pvVar9);
        ConstantVector::SetNull(pVVar11,false);
        pvVar6 = vector<duckdb::DatePartSpecifier,_true>::get<true>(part_codes,uVar13);
        uVar15 = (ulong)*pvVar6;
        pvVar7 = vector<unsigned_long,_true>::get<true>(&owners,uVar15);
        if (uVar13 == *pvVar7) {
          pvVar6 = vector<duckdb::DatePartSpecifier,_true>::get<true>(part_codes,uVar13);
          if (*pvVar6 < BEGIN_DOUBLE) {
            pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar9);
            pdVar14 = (value_type)pVVar11->data;
            ppdVar8 = (reference)vector<long_*,_true>::get<true>(&bigint_values,uVar15);
          }
          else {
            pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(pvVar9);
            pdVar14 = (value_type)pVVar11->data;
            ppdVar8 = vector<double_*,_true>::get<true>(&double_values,uVar15 - 0x16);
          }
          *ppdVar8 = pdVar14;
        }
      }
      DatePart::StructOperator::Operation<duckdb::interval_t>
                (&bigint_values,&double_values,(interval_t *)local_e0->data,0,local_d0);
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&rdata);
    Vector::ToUnifiedFormat(local_e0,local_d8,&rdata);
    local_e0 = (reference)rdata.data;
    Vector::SetVectorType(result,FLAT_VECTOR);
    FlatVector::VerifyFlatVector(result);
    if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask !=
        (unsigned_long *)0x0) {
      TemplatedValidityMask<unsigned_long>::SetAllValid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,local_d8);
    }
    for (uVar13 = 0;
        uVar13 < (ulong)((long)(this->
                               super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                               ).
                               super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->
                               super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                               ).
                               super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar13 = uVar13 + 1)
    {
      pvVar9 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::get<true>(this,uVar13);
      pVVar10 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                          (pvVar9);
      Vector::SetVectorType(pVVar10,FLAT_VECTOR);
      pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (pvVar9);
      FlatVector::VerifyFlatVector(pVVar11);
      if ((pVVar11->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        TemplatedValidityMask<unsigned_long>::SetAllValid
                  (&(pVVar11->validity).super_TemplatedValidityMask<unsigned_long>,local_d8);
      }
      pvVar6 = vector<duckdb::DatePartSpecifier,_true>::get<true>(part_codes,uVar13);
      uVar15 = (ulong)*pvVar6;
      pvVar7 = vector<unsigned_long,_true>::get<true>(&owners,uVar15);
      if (uVar13 == *pvVar7) {
        pvVar6 = vector<duckdb::DatePartSpecifier,_true>::get<true>(part_codes,uVar13);
        if (*pvVar6 < BEGIN_DOUBLE) {
          pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (pvVar9);
          pdVar14 = (value_type)pVVar11->data;
          ppdVar8 = (reference)vector<long_*,_true>::get<true>(&bigint_values,uVar15);
        }
        else {
          pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (pvVar9);
          pdVar14 = (value_type)pVVar11->data;
          ppdVar8 = vector<double_*,_true>::get<true>(&double_values,uVar15 - 0x16);
        }
        *ppdVar8 = pdVar14;
      }
    }
    for (row_idx = 0; row_idx != local_d8; row_idx = row_idx + 1) {
      iVar12 = row_idx;
      if ((rdata.sel)->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)(rdata.sel)->sel_vector[row_idx];
      }
      if ((rdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((rdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar12 >> 6] >>
           (iVar12 & 0x3f) & 1) != 0)) {
        DatePart::StructOperator::Operation<duckdb::interval_t>
                  (&bigint_values,&double_values,
                   (interval_t *)(&local_e0->vector_type + iVar12 * 0x10),row_idx,local_d0);
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
        puVar3 = (this->
                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_00 = (this->
                       super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar3;
            this_00 = this_00 + 1) {
          pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (this_00);
          FlatVector::VerifyFlatVector(pVVar11);
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(pVVar11->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
        }
      }
    }
    UnifiedVectorFormat::~UnifiedVectorFormat(&rdata);
  }
  for (uVar13 = 0;
      uVar13 < (ulong)((long)(this->
                             super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->
                             super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar13 = uVar13 + 1) {
    pvVar6 = vector<duckdb::DatePartSpecifier,_true>::get<true>(part_codes,uVar13);
    pvVar7 = vector<unsigned_long,_true>::get<true>(&owners,(ulong)*pvVar6);
    __n = *pvVar7;
    if (uVar13 != __n) {
      pvVar9 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::get<true>(this,uVar13);
      pVVar10 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                          (pvVar9);
      pvVar9 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
               ::get<true>(this,__n);
      pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (pvVar9);
      Vector::Reference(pVVar10,pVVar11);
    }
  }
  Vector::Verify(result,local_d8);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&owners);
  ::std::_Vector_base<double_*,_std::allocator<double_*>_>::~_Vector_base
            ((_Vector_base<double_*,_std::allocator<double_*>_> *)&double_values);
  ::std::_Vector_base<long_*,_std::allocator<long_*>_>::~_Vector_base
            ((_Vector_base<long_*,_std::allocator<long_*>_> *)&bigint_values);
  return;
}

Assistant:

static void Function(DataChunk &args, ExpressionState &state, Vector &result) {
		auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
		auto &info = func_expr.bind_info->Cast<BindData>();
		D_ASSERT(args.ColumnCount() == 1);

		const auto count = args.size();
		Vector &input = args.data[0];

		//	Type counts
		const auto BIGINT_COUNT = size_t(DatePartSpecifier::BEGIN_DOUBLE) - size_t(DatePartSpecifier::BEGIN_BIGINT);
		const auto DOUBLE_COUNT = size_t(DatePartSpecifier::BEGIN_INVALID) - size_t(DatePartSpecifier::BEGIN_DOUBLE);
		DatePart::StructOperator::bigint_vec bigint_values(BIGINT_COUNT, nullptr);
		DatePart::StructOperator::double_vec double_values(DOUBLE_COUNT, nullptr);
		const auto part_mask = DatePart::StructOperator::GetMask(info.part_codes);

		auto &child_entries = StructVector::GetEntries(result);

		// The first computer of a part "owns" it
		// and other requestors just reference the owner
		vector<size_t> owners(int(DatePartSpecifier::JULIAN_DAY) + 1, child_entries.size());
		for (size_t col = 0; col < child_entries.size(); ++col) {
			const auto part_index = size_t(info.part_codes[col]);
			if (owners[part_index] == child_entries.size()) {
				owners[part_index] = col;
			}
		}

		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				for (size_t col = 0; col < child_entries.size(); ++col) {
					auto &child_entry = child_entries[col];
					ConstantVector::SetNull(*child_entry, false);
					const auto part_index = size_t(info.part_codes[col]);
					if (owners[part_index] == col) {
						if (IsBigintDatepart(info.part_codes[col])) {
							bigint_values[part_index - size_t(DatePartSpecifier::BEGIN_BIGINT)] =
							    ConstantVector::GetData<int64_t>(*child_entry);
						} else {
							double_values[part_index - size_t(DatePartSpecifier::BEGIN_DOUBLE)] =
							    ConstantVector::GetData<double>(*child_entry);
						}
					}
				}
				auto tdata = ConstantVector::GetData<INPUT_TYPE>(input);
				if (Value::IsFinite(tdata[0])) {
					DatePart::StructOperator::Operation(bigint_values, double_values, tdata[0], 0, part_mask);
				} else {
					for (auto &child_entry : child_entries) {
						ConstantVector::SetNull(*child_entry, true);
					}
				}
			}
		} else {
			UnifiedVectorFormat rdata;
			input.ToUnifiedFormat(count, rdata);

			const auto &arg_valid = rdata.validity;
			auto tdata = UnifiedVectorFormat::GetData<INPUT_TYPE>(rdata);

			// Start with a valid flat vector
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto &res_valid = FlatVector::Validity(result);
			if (res_valid.GetData()) {
				res_valid.SetAllValid(count);
			}

			// Start with valid children
			for (size_t col = 0; col < child_entries.size(); ++col) {
				auto &child_entry = child_entries[col];
				child_entry->SetVectorType(VectorType::FLAT_VECTOR);
				auto &child_validity = FlatVector::Validity(*child_entry);
				if (child_validity.GetData()) {
					child_validity.SetAllValid(count);
				}

				// Pre-multiplex
				const auto part_index = size_t(info.part_codes[col]);
				if (owners[part_index] == col) {
					if (IsBigintDatepart(info.part_codes[col])) {
						bigint_values[part_index - size_t(DatePartSpecifier::BEGIN_BIGINT)] =
						    FlatVector::GetData<int64_t>(*child_entry);
					} else {
						double_values[part_index - size_t(DatePartSpecifier::BEGIN_DOUBLE)] =
						    FlatVector::GetData<double>(*child_entry);
					}
				}
			}

			for (idx_t i = 0; i < count; ++i) {
				const auto idx = rdata.sel->get_index(i);
				if (arg_valid.RowIsValid(idx)) {
					if (Value::IsFinite(tdata[idx])) {
						DatePart::StructOperator::Operation(bigint_values, double_values, tdata[idx], i, part_mask);
					} else {
						for (auto &child_entry : child_entries) {
							FlatVector::Validity(*child_entry).SetInvalid(i);
						}
					}
				} else {
					res_valid.SetInvalid(i);
					for (auto &child_entry : child_entries) {
						FlatVector::Validity(*child_entry).SetInvalid(i);
					}
				}
			}
		}

		// Reference any duplicate parts
		for (size_t col = 0; col < child_entries.size(); ++col) {
			const auto part_index = size_t(info.part_codes[col]);
			const auto owner = owners[part_index];
			if (owner != col) {
				child_entries[col]->Reference(*child_entries[owner]);
			}
		}

		result.Verify(count);
	}